

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,unsigned_int,char>
          (basic_appender<char> out,uint count,char *value)

{
  basic_appender<char> this;
  char *in_RDX;
  uint in_ESI;
  buffer<char> *in_RDI;
  uint i;
  char c;
  uint local_24;
  basic_appender<char> local_10 [2];
  
  local_10[0].container = in_RDI;
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    c = *in_RDX;
    this = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*((basic_appender<char> *)&stack0xffffffffffffffd0);
    basic_appender<char>::operator=((basic_appender<char> *)this.container,c);
  }
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}